

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::DisplayGraph(cmComputeTargetDepends *this,Graph *graph,string *name)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t sVar3;
  FILE *pFVar4;
  long lVar5;
  string *psVar6;
  cmGraphEdge *ni;
  pointer pcVar7;
  long lVar8;
  char *pcVar9;
  
  fprintf(_stderr,"The %s target dependency graph is:\n",(name->_M_dataplus)._M_p);
  lVar5 = (long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    lVar5 = lVar5 / 0x18;
    lVar8 = 0;
    do {
      pFVar4 = _stderr;
      pcVar1 = (graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8]);
      fprintf(pFVar4,"target %zu is [%s]\n",lVar8,(psVar6->_M_dataplus)._M_p);
      pcVar2 = *(pointer *)
                ((long)&pcVar1[lVar8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      for (pcVar7 = *(pointer *)
                     &pcVar1[lVar8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          pFVar4 = _stderr, pcVar7 != pcVar2; pcVar7 = pcVar7 + 1) {
        sVar3 = pcVar7->Dest;
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((this->Targets).
                            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar3]);
        pcVar9 = "weak";
        if (pcVar7->Strong != false) {
          pcVar9 = "strong";
        }
        fprintf(pFVar4,"  depends on target %zu [%s] (%s)\n",sVar3,(psVar6->_M_dataplus)._M_p,pcVar9
               );
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar5 + (ulong)(lVar5 == 0));
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayGraph(Graph const& graph,
                                          const std::string& name)
{
  fprintf(stderr, "The %s target dependency graph is:\n", name.c_str());
  size_t n = graph.size();
  for (size_t depender_index = 0; depender_index < n; ++depender_index) {
    EdgeList const& nl = graph[depender_index];
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %zu is [%s]\n", depender_index,
            depender->GetName().c_str());
    for (cmGraphEdge const& ni : nl) {
      size_t dependee_index = ni;
      cmGeneratorTarget const* dependee = this->Targets[dependee_index];
      fprintf(stderr, "  depends on target %zu [%s] (%s)\n", dependee_index,
              dependee->GetName().c_str(), ni.IsStrong() ? "strong" : "weak");
    }
  }
  fprintf(stderr, "\n");
}